

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

undefined4 __thiscall
despot::RockSampleENTScenarioLowerBound::Value
          (RockSampleENTScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  uint uVar1;
  State *pSVar2;
  int iVar3;
  pointer ppSVar4;
  long lVar5;
  BaseRockSample *pBVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  Coord rob_pos;
  Coord rock_pos;
  vector<double,_std::allocator<double>_> expected_sampling_value;
  undefined8 local_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  vector<double,_std::allocator<double>_> local_58;
  undefined4 local_40 [4];
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_58,(long)this->rs_model_->num_rocks_,(allocator_type *)&local_80);
  despot::Coord::Coord((Coord *)&local_80);
  ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_68 = 0.0;
  local_60 = 0.0;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar4) {
    uVar10 = 0;
    do {
      pSVar2 = ppSVar4[uVar10];
      local_80 = Grid<int>::GetCoord(&this->rs_model_->grid_,
                                     *(int *)(pSVar2 + 0xc) >>
                                     ((byte)this->rs_model_->num_rocks_ & 0x1f));
      local_60 = local_60 + *(double *)(pSVar2 + 0x18);
      lVar5 = (long)this->rs_model_->num_rocks_;
      if (0 < lVar5) {
        uVar1 = *(uint *)(pSVar2 + 0xc);
        lVar8 = 0;
        do {
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] =
               *(double *)(pSVar2 + 0x18) *
               *(double *)(&DAT_00115060 + (ulong)((uVar1 >> ((uint)lVar8 & 0x1f) & 1) == 0) * 8) +
               local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar5 != lVar8);
      }
      uVar10 = uVar10 + 1;
      ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(particles->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3
                             ));
    local_60 = local_60 * 10.0;
  }
  local_70 = 1.0;
  iVar7 = -1;
  do {
    iVar3 = this->grid_->xsize_;
    iVar9 = this->grid_->ysize_;
    despot::Coord::Coord((Coord *)&local_78,-1,-1);
    pBVar6 = this->rs_model_;
    if (pBVar6->num_rocks_ < 1) {
      iVar3 = -1;
    }
    else {
      iVar9 = iVar9 + iVar3;
      uVar10 = 0xffffffff;
      uVar11 = 0;
      do {
        iVar3 = despot::Coord::ManhattanDistance
                          (local_80,*(undefined8 *)
                                     ((pBVar6->rock_pos_).
                                      super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar11 * 8));
        if ((0.1 < local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11]) && (iVar3 < iVar9)) {
          local_78 = *(undefined8 *)
                      ((this->rs_model_->rock_pos_).
                       super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar11 * 8);
          uVar10 = uVar11 & 0xffffffff;
          iVar9 = iVar3;
        }
        iVar3 = (int)uVar10;
        uVar11 = uVar11 + 1;
        pBVar6 = this->rs_model_;
      } while ((long)uVar11 < (long)pBVar6->num_rocks_);
    }
    if (iVar3 != -1) {
      if (iVar7 == -1) {
        iVar7 = 3;
        if (((int)local_80 <= (int)local_78) && (iVar7 = 1, (int)local_78 <= (int)local_80)) {
          iVar7 = 2;
          if (local_80._4_4_ <= local_78._4_4_) {
            iVar7 = (uint)(local_78._4_4_ <= local_80._4_4_) << 2;
          }
        }
      }
      iVar9 = despot::Coord::ManhattanDistance(local_78,local_80);
      dVar12 = pow(_ParticleBelief,(double)iVar9);
      local_70 = local_70 * dVar12;
      local_68 = local_68 +
                 local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3] * local_70;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar3] = -1.0;
      local_80 = local_78;
    }
  } while (iVar3 != -1);
  dVar12 = pow(_ParticleBelief,(double)(this->grid_->xsize_ - (int)local_80));
  iVar3 = 1;
  if (iVar7 != -1) {
    iVar3 = iVar7;
  }
  despot::ValuedAction::ValuedAction
            ((ValuedAction *)local_40,iVar3,dVar12 * local_60 * local_70 + local_68);
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_40[0];
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		vector<double> expected_sampling_value = vector<double>(
			rs_model_->num_rocks_);
		Coord rob_pos;
		double weight = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			rob_pos = rs_model_->GetRobPos(particle);
			weight += particle->weight;
			for (int i = 0; i < rs_model_->num_rocks_; i++) {
				expected_sampling_value[i] += particle->weight
					* (rs_model_->GetRock(particle, i) ? 10 : -10);
			}
		}

		ACT_TYPE action = -1;
		double value = 0;
		double discount = 1.0;
		while (true) {
			// Move to the nearest valuable rock and sample
			int shortest = grid_.xsize() + grid_.ysize();
			int id = -1;
			Coord rock_pos(-1, -1);
			for (int rock = 0; rock < rs_model_->num_rocks_; rock++) {
				int dist = Coord::ManhattanDistance(rob_pos,
					rs_model_->rock_pos_[rock]);
				if (expected_sampling_value[rock] > 0.1 && dist < shortest) {
					shortest = dist;
					id = rock;
					rock_pos = rs_model_->rock_pos_[rock];
				}
			}
			/*
			 // Move to the most valuable rock and sample
			 int best = 0;
			 int id = -1;
			 Coord rock_pos(-1, -1);
			 for (int rock=0; rock<rs_model_->num_rocks_; rock++) {
			 double v = expected_sampling_value[rock] * Globals::Discount(Coord::ManhattanDistance(rob_pos, rs_model_->rock_pos_[rock]));
			 if (v > best) {
			 best = v;
			 id = rock;
			 rock_pos = rs_model_->rock_pos_[rock];
			 }
			 }
			 */

			if (id == -1)
				break;

			if (action == -1) {
				if (rock_pos.x < rob_pos.x)
					action = Compass::WEST;
				else if (rock_pos.x > rob_pos.x)
					action = Compass::EAST;
				else if (rock_pos.y < rob_pos.y)
					action = Compass::SOUTH;
				else if (rock_pos.y > rob_pos.y)
					action = Compass::NORTH;
				else
					action = rs_model_->E_SAMPLE;
			}

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * expected_sampling_value[id];
			expected_sampling_value[id] = -1; // set to bad rock
			rob_pos = rock_pos;
		}

		if (action == -1)
			action = Compass::EAST;

		value += 10 * weight * discount * Globals::Discount(grid_.xsize() - rob_pos.x);

		return ValuedAction(action, value);
	}